

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_revxspc(char *s,char *n,size_t len)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  
  lVar1 = len - 1;
  lVar7 = lVar1;
  if (0 < (long)len) {
    cVar2 = *n;
    do {
      if (cVar2 != '\0') {
        pp_Var4 = __ctype_tolower_loc();
        pcVar5 = n + 1;
        cVar6 = cVar2;
        do {
          if ((*pp_Var4)[s[lVar7]] == (*pp_Var4)[cVar6]) goto LAB_0010574b;
          cVar6 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar6 != '\0');
      }
      bVar3 = 0 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar3);
    lVar7 = -1;
  }
LAB_0010574b:
  return lVar1 - lVar7;
}

Assistant:

size_t coda_revxspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}